

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall r_exec::View::mod_res(View *this,double value)

{
  byte bVar1;
  Atom *this_00;
  Atom local_1c [4];
  double local_18;
  double value_local;
  View *this_local;
  
  local_18 = value;
  value_local = (double)this;
  this_00 = r_code::View::code(&this->super_View,4);
  r_code::Atom::PlusInfinity();
  bVar1 = r_code::Atom::operator==(this_00,local_1c);
  r_code::Atom::~Atom(local_1c);
  if ((bVar1 & 1) == 0) {
    this->acc_res = (float)((double)this->acc_res + local_18);
    this->res_changes = this->res_changes + 1;
  }
  return;
}

Assistant:

void View::mod_res(double value)
{
    if (code(VIEW_RES) == Atom::PlusInfinity()) {
        return;
    }

    acc_res += value;
    ++res_changes;
}